

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterRegistry.cpp
# Opt level: O0

void Assimp::DeleteImporterInstanceList
               (vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *deleteList)

{
  size_type sVar1;
  reference ppBVar2;
  ulong local_18;
  size_t i;
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> *deleteList_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::size
                      (deleteList);
    if (sVar1 <= local_18) break;
    ppBVar2 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
              operator[](deleteList,local_18);
    if (*ppBVar2 != (value_type)0x0) {
      (*(*ppBVar2)->_vptr_BaseImporter[2])();
    }
    ppBVar2 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
              operator[](deleteList,local_18);
    *ppBVar2 = (value_type)0x0;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void DeleteImporterInstanceList(std::vector< BaseImporter* >& deleteList){
	for(size_t i= 0; i<deleteList.size();++i){
		delete deleteList[i];
		deleteList[i]=nullptr;
	}//for
}